

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O1

bool spvIsInIdType(spv_operand_type_t type)

{
  return (type & SPV_OPERAND_TYPE_LITERAL_INTEGER) != SPV_OPERAND_TYPE_TYPE_ID &&
         type - SPV_OPERAND_TYPE_ID < 5;
}

Assistant:

bool spvIsIdType(spv_operand_type_t type) {
  switch (type) {
    case SPV_OPERAND_TYPE_ID:
    case SPV_OPERAND_TYPE_TYPE_ID:
    case SPV_OPERAND_TYPE_RESULT_ID:
    case SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID:
    case SPV_OPERAND_TYPE_SCOPE_ID:
      return true;
    default:
      return false;
  }
}